

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::detail::
     handle_cstring_type_spec<char,fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  cstring_spec_handler *handler_local;
  char spec_local;
  
  if ((spec == '\0') || (spec == 's')) {
    arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
    cstring_spec_handler::on_string(handler);
  }
  else {
    if (spec != 'p') {
      error_handler::on_error((error_handler *)handler,"invalid type specifier");
    }
    arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
    cstring_spec_handler::on_pointer(handler);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}